

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR subelems_allocator(lysp_yin_ctx *ctx,size_t count,lysp_node *parent,yin_subelement **result,
                         ...)

{
  int iVar1;
  char in_AL;
  yin_subelement *pyVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  LY_ERR LVar9;
  long lVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  pyVar2 = (yin_subelement *)calloc(count,0x18);
  *result = pyVar2;
  if (pyVar2 == (yin_subelement *)0x0) {
    pyVar2 = (yin_subelement *)0x0;
LAB_001808e1:
    subelems_deallocator(count,pyVar2);
    LVar9 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","subelems_allocator"
          );
  }
  else {
    local_100 = &ap[0].overflow_arg_area;
    uVar5 = 0x20;
    if (count != 0) {
      lVar10 = 0;
      sVar11 = count;
      do {
        uVar6 = (ulong)uVar5;
        if (uVar6 < 0x29) {
          uVar5 = uVar5 + 8;
          ppvVar4 = (void **)((long)local_e8 + uVar6);
        }
        else {
          ppvVar4 = local_100;
          local_100 = local_100 + 1;
        }
        iVar1 = *(int *)ppvVar4;
        pyVar2 = *result;
        *(int *)((long)&pyVar2->type + lVar10) = iVar1;
        uVar8 = uVar5;
        if (iVar1 < 0x400) {
          if (iVar1 < 0x10) {
            switch(iVar1) {
            case 1:
            case 2:
            case 4:
            case 8:
              goto switchD_00180776_caseD_1;
            default:
              goto switchD_00180776_caseD_3;
            }
          }
          if (0x7f < iVar1) {
            if (((iVar1 != 0x80) && (iVar1 != 0x100)) && (iVar1 != 0x200))
            goto switchD_00180776_caseD_3;
switchD_00180776_caseD_1:
            puVar3 = (undefined8 *)calloc(1,0x10);
            if (puVar3 != (undefined8 *)0x0) {
              *puVar3 = parent;
              uVar7 = (ulong)uVar5;
              if (uVar7 < 0x29) {
                uVar8 = uVar5 + 8;
                goto LAB_001807ab;
              }
LAB_00180865:
              ppvVar4 = local_100;
              local_100 = local_100 + 1;
              goto LAB_00180873;
            }
            goto LAB_001808e1;
          }
          if ((iVar1 - 0x10U < 0x31) &&
             ((0x1000000010001U >> ((ulong)(iVar1 - 0x10U) & 0x3f) & 1) != 0))
          goto switchD_00180776_caseD_1;
switchD_00180776_caseD_3:
          uVar6 = (ulong)uVar5;
          if (uVar6 < 0x29) {
            uVar5 = uVar5 + 8;
            ppvVar4 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar4 = local_100;
            local_100 = local_100 + 1;
          }
          puVar3 = (undefined8 *)*ppvVar4;
          uVar8 = uVar5;
        }
        else {
          if (iVar1 < 0x4000) {
            if (iVar1 < 0x1000) {
              if ((iVar1 != 0x400) && (iVar1 != 0x800)) goto switchD_00180776_caseD_3;
            }
            else if ((iVar1 != 0x1000) && (iVar1 != 0x2000)) goto switchD_00180776_caseD_3;
            goto switchD_00180776_caseD_1;
          }
          if (iVar1 < 0x140000) {
            if ((iVar1 != 0x4000) && (iVar1 != 0x8000)) goto switchD_00180776_caseD_3;
            goto switchD_00180776_caseD_1;
          }
          if ((iVar1 != 0x140000) && (iVar1 != 0x150000)) {
            if (iVar1 != 0x2f0000) goto switchD_00180776_caseD_3;
            goto switchD_00180776_caseD_1;
          }
          puVar3 = (undefined8 *)calloc(1,0x10);
          if (puVar3 == (undefined8 *)0x0) goto LAB_001808e1;
          uVar6 = (ulong)uVar5;
          if (0x28 < uVar6) {
            *puVar3 = *local_100;
            local_100 = local_100 + 1;
            goto LAB_00180865;
          }
          uVar7 = uVar6 + 8;
          *puVar3 = *(undefined8 *)((long)local_e8 + uVar6);
          uVar8 = (uint)uVar7;
          if (0x20 < uVar5) goto LAB_00180865;
          uVar8 = uVar5 + 0x10;
LAB_001807ab:
          ppvVar4 = (void **)((long)local_e8 + uVar7);
LAB_00180873:
          puVar3[1] = *ppvVar4;
        }
        *(undefined8 **)((long)&pyVar2->dest + lVar10) = puVar3;
        if ((ulong)uVar8 < 0x29) {
          ppvVar4 = (void **)((long)local_e8 + (ulong)uVar8);
          uVar5 = uVar8 + 8;
        }
        else {
          ppvVar4 = local_100;
          local_100 = local_100 + 1;
          uVar5 = uVar8;
        }
        *(undefined2 *)((long)&(*result)->flags + lVar10) = *(undefined2 *)ppvVar4;
        lVar10 = lVar10 + 0x18;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
    }
    LVar9 = LY_SUCCESS;
  }
  return LVar9;
}

Assistant:

static LY_ERR
subelems_allocator(struct lysp_yin_ctx *ctx, size_t count, struct lysp_node *parent,
        struct yin_subelement **result, ...)
{
    va_list ap;

    *result = calloc(count, sizeof **result);
    LY_CHECK_GOTO(!(*result), mem_err);

    va_start(ap, result);
    for (size_t i = 0; i < count; ++i) {
        /* TYPE */
        (*result)[i].type = va_arg(ap, enum ly_stmt);
        /* DEST */
        if (IS_NODE_ELEM((*result)[i].type)) {
            struct tree_node_meta *node_meta = NULL;

            node_meta = calloc(1, sizeof *node_meta);
            LY_CHECK_GOTO(!node_meta, mem_err);
            node_meta->parent = parent;
            node_meta->nodes = va_arg(ap, void *);
            (*result)[i].dest = node_meta;
        } else if ((*result)[i].type == LY_STMT_IMPORT) {
            struct import_meta *imp_meta = NULL;

            imp_meta = calloc(1, sizeof *imp_meta);
            LY_CHECK_GOTO(!imp_meta, mem_err);
            imp_meta->prefix = va_arg(ap, const char *);
            imp_meta->imports = va_arg(ap, struct lysp_import **);
            (*result)[i].dest = imp_meta;
        } else if ((*result)[i].type == LY_STMT_INCLUDE) {
            struct include_meta *inc_meta = NULL;

            inc_meta = calloc(1, sizeof *inc_meta);
            LY_CHECK_GOTO(!inc_meta, mem_err);
            inc_meta->name = va_arg(ap, const char *);
            inc_meta->includes = va_arg(ap, struct lysp_include **);
            (*result)[i].dest = inc_meta;
        } else if (((*result)[i].type == LY_STMT_INPUT) || ((*result)[i].type == LY_STMT_OUTPUT)) {
            struct inout_meta *inout_meta = NULL;

            inout_meta = calloc(1, sizeof *inout_meta);
            LY_CHECK_GOTO(!inout_meta, mem_err);
            inout_meta->parent = parent;
            inout_meta->inout_p = va_arg(ap, struct lysp_node_action_inout *);
            (*result)[i].dest = inout_meta;
        } else {
            (*result)[i].dest = va_arg(ap, void *);
        }
        /* FLAGS */
        (*result)[i].flags = va_arg(ap, int);
    }
    va_end(ap);

    return LY_SUCCESS;

mem_err:
    subelems_deallocator(count, *result);
    LOGMEM(ctx->xmlctx->ctx);
    return LY_EMEM;
}